

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O3

void ev3dev::sound::tone(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         *sequence,bool bSynchronous)

{
  pointer pvVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  pointer __x;
  vector<float,_std::allocator<float>_> v;
  ostringstream args;
  undefined1 local_1d0 [36];
  undefined4 local_1ac;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1ac = (undefined4)CONCAT71(in_register_00000031,bSynchronous);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  __x = (sequence->
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (sequence->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pvVar1) {
    bVar2 = true;
    do {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_1d0,__x);
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," -n",3);
      }
      if (local_1d0._8_8_ != local_1d0._0_8_) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," -f ",4);
        std::ostream::_M_insert<double>((double)*(float *)local_1d0._0_8_);
        if (4 < (ulong)(local_1d0._8_8_ - local_1d0._0_8_)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," -l ",4);
          std::ostream::_M_insert<double>((double)*(float *)(local_1d0._0_8_ + 4));
          if (8 < (ulong)(local_1d0._8_8_ - local_1d0._0_8_)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," -D ",4);
            std::ostream::_M_insert<double>((double)*(float *)(local_1d0._0_8_ + 8));
          }
        }
      }
      if ((float *)local_1d0._0_8_ != (float *)0x0) {
        operator_delete((void *)local_1d0._0_8_);
      }
      __x = __x + 1;
      bVar2 = false;
    } while (__x != pvVar1);
  }
  std::__cxx11::stringbuf::str();
  beep((string *)local_1d0,local_1ac._0_1_);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void sound::tone(
        const std::vector< std::vector<float> > &sequence,
        bool bSynchronous
        )
{
    std::ostringstream args;
    bool first = true;

    for(auto v : sequence) {
        if (first) {
            first = false;
        } else {
            args << " -n";
        }

        if (v.size() > 0) {
            args << " -f " << v[0];
        } else {
            continue;
        }

        if (v.size() > 1) {
            args << " -l " << v[1];
        } else {
            continue;
        }

        if (v.size() > 2) {
            args << " -D " << v[2];
        } else {
            continue;
        }
    }

    beep(args.str(), bSynchronous);
}